

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O1

Regexp * __thiscall
duckdb_re2::Regexp::Walker<duckdb_re2::Regexp_*>::WalkInternal
          (Walker<duckdb_re2::Regexp_*> *this,Regexp *re,Regexp *top_arg,bool use_copy)

{
  stack<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>_>
  *this_00;
  iterator *piVar1;
  ushort uVar2;
  uint uVar3;
  Regexp *pRVar4;
  _Elt_pointer pWVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  Regexp *pRVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Regexp **ppRVar10;
  _Elt_pointer pWVar11;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar12;
  Regexp *unaff_R13;
  bool stop;
  Regexp *local_1b8;
  undefined1 local_1b0 [8];
  int iStack_1a8;
  undefined4 uStack_1a4;
  Regexp *local_1a0;
  Regexp *pRStack_198;
  Regexp *local_190;
  Regexp **ppRStack_188;
  ios_base local_138 [264];
  undefined4 extraout_var_00;
  
  Reset(this);
  if (re == (Regexp *)0x0) {
    local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&iStack_1a8,"Walk NULL",9);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_1a8);
    std::ios_base::~ios_base(local_138);
  }
  else {
    this_00 = &this->stack_;
    iStack_1a8 = -1;
    ppRStack_188 = (Regexp **)0x0;
    pWVar11 = (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_1b0 = (undefined1  [8])re;
    local_1a0 = top_arg;
    if (pWVar11 ==
        (this->stack_).c.
        super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
      ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Regexp*>>
                ((deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
                  *)this_00,(WalkState<duckdb_re2::Regexp_*> *)local_1b0);
    }
    else {
      pWVar11->child_arg = local_190;
      pWVar11->child_args = (Regexp **)0x0;
      pWVar11->parent_arg = top_arg;
      pWVar11->pre_arg = pRStack_198;
      pWVar11->re = re;
      *(ulong *)&pWVar11->n = CONCAT44(uStack_1a4,0xffffffff);
      piVar1 = &(this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    do {
      pWVar11 = (this->stack_).c.
                super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pWVar11 ==
          (this->stack_).c.
          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pWVar11 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
      }
      pRVar4 = pWVar11[-1].re;
      pRVar9 = unaff_R13;
      if (pWVar11[-1].n == -1) {
        iVar8 = this->max_visits_;
        this->max_visits_ = iVar8 + -1;
        if (iVar8 < 1) {
          this->stopped_early_ = true;
          iVar8 = (*this->_vptr_Walker[5])(this,pRVar4,pWVar11[-1].parent_arg);
          pRVar9 = (Regexp *)CONCAT44(extraout_var_00,iVar8);
        }
        else {
          local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffffffffff00);
          iVar8 = (*this->_vptr_Walker[2])(this,pRVar4,pWVar11[-1].parent_arg,local_1b0);
          pWVar11[-1].pre_arg = (Regexp *)CONCAT44(extraout_var,iVar8);
          cVar6 = local_1b0[0];
          pRVar9 = (Regexp *)CONCAT44(extraout_var,iVar8);
          if (local_1b0[0] == '\0') {
            pWVar11[-1].n = 0;
            pWVar11[-1].child_args = (Regexp **)0x0;
            uVar2 = pRVar4->nsub_;
            pRVar9 = unaff_R13;
            if (uVar2 != 0) {
              if (uVar2 == 1) {
                ppRVar10 = &pWVar11[-1].child_arg;
              }
              else {
                ppRVar10 = (Regexp **)operator_new__((ulong)uVar2 << 3);
              }
              pWVar11[-1].child_args = ppRVar10;
            }
          }
          if (cVar6 == '\0') goto LAB_01ce6cec;
        }
LAB_01ce6eb3:
        std::
        deque<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
        ::pop_back(&this_00->c);
        pWVar11 = (this->stack_).c.
                  super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pWVar11 ==
            (this->stack_).c.
            super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          iVar8 = 1;
          local_1b8 = pRVar9;
        }
        else {
          if (pWVar11 ==
              (this->stack_).c.
              super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pWVar11 = (this->stack_).c.
                      super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
          }
          if (pWVar11[-1].child_args == (Regexp **)0x0) {
            ppRVar10 = &pWVar11[-1].child_arg;
          }
          else {
            ppRVar10 = pWVar11[-1].child_args + pWVar11[-1].n;
          }
          *ppRVar10 = pRVar9;
          pWVar11[-1].n = pWVar11[-1].n + 1;
          iVar8 = 0;
        }
      }
      else {
LAB_01ce6cec:
        uVar2 = pRVar4->nsub_;
        if (uVar2 == 0) {
LAB_01ce6e61:
          iVar8 = (*this->_vptr_Walker[3])
                            (this,pRVar4,pWVar11[-1].parent_arg,pWVar11[-1].pre_arg,
                             pWVar11[-1].child_args,(ulong)(uint)pWVar11[-1].n);
          pRVar9 = (Regexp *)CONCAT44(extraout_var_02,iVar8);
          if ((1 < pRVar4->nsub_) && (pWVar11[-1].child_args != (Regexp **)0x0)) {
            operator_delete__(pWVar11[-1].child_args);
          }
          goto LAB_01ce6eb3;
        }
        if (uVar2 == 1) {
          paVar12 = &pRVar4->field_5;
        }
        else {
          paVar12 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar4->field_5).submany_;
        }
        uVar3 = pWVar11[-1].n;
        iVar8 = 0;
        if ((int)uVar3 < (int)(uint)uVar2) {
          if (((int)uVar3 < 1 || !use_copy) ||
             ((Regexp *)paVar12[uVar3 - 1].submany_ != (Regexp *)paVar12[uVar3].submany_)) {
            local_1b0 = (undefined1  [8])paVar12[pWVar11[-1].n].submany_;
            local_1a0 = pWVar11[-1].pre_arg;
            iStack_1a8 = -1;
            ppRStack_188 = (Regexp **)0x0;
            pWVar5 = (this->stack_).c.
                     super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pWVar5 == (this->stack_).c.
                          super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::
              deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
              ::_M_push_back_aux<duckdb_re2::WalkState<duckdb_re2::Regexp*>>
                        ((deque<duckdb_re2::WalkState<duckdb_re2::Regexp*>,std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp*>>>
                          *)this_00,(WalkState<duckdb_re2::Regexp_*> *)local_1b0);
            }
            else {
              pWVar5->child_arg = local_190;
              pWVar5->child_args = (Regexp **)0x0;
              pWVar5->parent_arg = local_1a0;
              pWVar5->pre_arg = pRStack_198;
              pWVar5->re = (Regexp *)local_1b0;
              *(ulong *)&pWVar5->n = CONCAT44(uStack_1a4,0xffffffff);
              piVar1 = &(this->stack_).c.
                        super__Deque_base<duckdb_re2::WalkState<duckdb_re2::Regexp_*>,_std::allocator<duckdb_re2::WalkState<duckdb_re2::Regexp_*>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
          }
          else {
            iVar7 = (*this->_vptr_Walker[4])(this,pWVar11[-1].child_args[uVar3 - 1]);
            iVar8 = pWVar11[-1].n;
            pWVar11[-1].child_args[iVar8] = (Regexp *)CONCAT44(extraout_var_01,iVar7);
            pWVar11[-1].n = iVar8 + 1;
          }
          iVar8 = 3;
        }
        if ((int)(uint)uVar2 <= (int)uVar3) goto LAB_01ce6e61;
      }
      unaff_R13 = pRVar9;
    } while ((iVar8 == 0) || (top_arg = local_1b8, iVar8 == 3));
  }
  return top_arg;
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_.push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_.top();
    re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        FALLTHROUGH_INTENDED;
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_.push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_.top().
    // Update next guy down.
    stack_.pop();
    if (stack_.empty())
      return t;
    s = &stack_.top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}